

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool_regress.c
# Opt level: O3

int cancel(int argc,char **argv)

{
  ulong uVar1;
  int iVar2;
  
  iVar2 = 0;
  uVar1 = strtoll(*argv,(char **)0x0,10);
  if (uVar1 < 0x65) {
    progress_userdata.limit = (double)(long)uVar1 / 100.0;
    zip_register_cancel_callback_with_state(za,cancel_callback,0,0);
    zip_register_progress_callback_with_state(0x3f50624dd2f1a9fc,za,progress_callback,0,0);
  }
  else {
    fprintf(_stderr,"invalid percentage \'%ld\' for cancel (valid: 0 <= x <= 100)\n",uVar1);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int
cancel(int argc, char *argv[]) {
    zip_int64_t percent;
    percent = strtoll(argv[0], NULL, 10);
    if (percent > 100 || percent < 0) {
	fprintf(stderr, "invalid percentage '%" PRId64 "' for cancel (valid: 0 <= x <= 100)\n", percent);
	return -1;
    }
    progress_userdata.limit = ((double)percent)/100;

    zip_register_cancel_callback_with_state(za, cancel_callback, NULL, NULL);

    /* needs the percentage updates from print_progress */
    print_progress(argc, argv);
    return 0;
}